

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<const_void_*,_(anonymous_namespace)::Data> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::Bucket::insert
          (Bucket *this)

{
  Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *this_00;
  size_t sVar1;
  byte bVar2;
  
  this_00 = this->span;
  sVar1 = this->index;
  bVar2 = this_00->nextFree;
  if (bVar2 == this_00->allocated) {
    Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::addStorage(this_00);
    bVar2 = this_00->nextFree;
  }
  this_00->nextFree = this_00->entries[bVar2].storage.data[0];
  this_00->offsets[sVar1] = bVar2;
  return (Node<const_void_*,_(anonymous_namespace)::Data> *)(this_00->entries + bVar2);
}

Assistant:

Node *insert() const
        {
            return span->insert(index);
        }